

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

void __thiscall
bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::insert
          (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this,size_t index,bool bit)

{
  _Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false> this_00;
  subtree_ref t;
  
  this_00._M_head_impl =
       (this->_impl)._M_t.
       super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
       _M_head_impl;
  t.super_subtree_ref_base<false>._index = 0;
  t.super_subtree_ref_base<false>._vector = this_00._M_head_impl;
  t.super_subtree_ref_base<false>._height = (this_00._M_head_impl)->height;
  t.super_subtree_ref_base<false>._size = (this_00._M_head_impl)->size;
  t.super_subtree_ref_base<false>._rank = (this_00._M_head_impl)->rank;
  internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::insert(this_00._M_head_impl,t,index,bit);
  return;
}

Assistant:

inline
    void bitvector_t<W, AP>::insert(size_t index, bool bit) {
        assert(valid() && "Can't access an uninitialized vector");
        _impl->insert(_impl->root(), index, bit);
    }